

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,ProStringList>>::
emplace<std::pair<QString,ProStringList>>
          (QMovableArrayOps<std::pair<QString,ProStringList>> *this,qsizetype i,
          pair<QString,_ProStringList> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  ProString *pPVar9;
  qsizetype qVar10;
  long lVar11;
  char16_t *__old_val_1;
  QTypedArrayData<char16_t> *__old_val;
  long in_FS_OFFSET;
  QArrayDataPointer<ProString> QStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_0024d11f:
    QStack_50.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_50.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pDVar5 = (args->first).d.d;
    pcVar6 = (args->first).d.ptr;
    (args->first).d.d = (Data *)0x0;
    (args->first).d.ptr = (char16_t *)0x0;
    qVar7 = (args->first).d.size;
    pDVar8 = (args->second).super_QList<ProString>.d.d;
    (args->first).d.size = 0;
    (args->second).super_QList<ProString>.d.d = (Data *)0x0;
    pPVar9 = (args->second).super_QList<ProString>.d.ptr;
    qVar10 = (args->second).super_QList<ProString>.d.size;
    (args->second).super_QList<ProString>.d.ptr = (ProString *)0x0;
    (args->second).super_QList<ProString>.d.size = 0;
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QString,_ProStringList>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QString,_ProStringList>_> *)this,
               (uint)(i == 0 && lVar3 != 0),1,(pair<QString,_ProStringList> **)0x0,
               (QArrayDataPointer<std::pair<QString,_ProStringList>_> *)0x0);
    lVar11 = *(long *)(this + 8);
    if (i == 0 && lVar3 != 0) {
      *(Data **)(lVar11 + -0x30) = pDVar5;
      *(char16_t **)(lVar11 + -0x28) = pcVar6;
      *(qsizetype *)(lVar11 + -0x20) = qVar7;
      *(Data **)(lVar11 + -0x18) = pDVar8;
      *(ProString **)(lVar11 + -0x10) = pPVar9;
      *(qsizetype *)(lVar11 + -8) = qVar10;
      *(long *)(this + 8) = lVar11 + -0x30;
    }
    else {
      puVar1 = (undefined8 *)(lVar11 + i * 0x30);
      memmove(puVar1 + 6,(void *)(lVar11 + i * 0x30),(*(long *)(this + 0x10) - i) * 0x30);
      *puVar1 = pDVar5;
      puVar1[1] = pcVar6;
      puVar1[2] = qVar7;
      puVar1[3] = pDVar8;
      puVar1[4] = pPVar9;
      puVar1[5] = qVar10;
    }
    QStack_50.size = 0;
    QStack_50.ptr = (ProString *)0x0;
    QStack_50.d = (Data *)0x0;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    QArrayDataPointer<ProString>::~QArrayDataPointer(&QStack_50);
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) - i !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) * -0x5555555555555555)) {
      lVar11 = i * 0x30;
      pDVar5 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(lVar3 + lVar11) = pDVar5;
      pcVar6 = (args->first).d.ptr;
      (args->first).d.ptr = (char16_t *)0x0;
      *(char16_t **)(lVar3 + 8 + lVar11) = pcVar6;
      qVar7 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(lVar3 + 0x10 + lVar11) = qVar7;
      pDVar8 = (args->second).super_QList<ProString>.d.d;
      (args->second).super_QList<ProString>.d.d = (Data *)0x0;
      *(Data **)(lVar3 + 0x18 + lVar11) = pDVar8;
      pPVar9 = (args->second).super_QList<ProString>.d.ptr;
      (args->second).super_QList<ProString>.d.ptr = (ProString *)0x0;
      *(ProString **)(lVar3 + 0x20 + lVar11) = pPVar9;
      qVar7 = (args->second).super_QList<ProString>.d.size;
      (args->second).super_QList<ProString>.d.size = 0;
      *(qsizetype *)(lVar3 + 0x28 + lVar11) = qVar7;
    }
    else {
      if ((i != 0) ||
         (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == uVar4))
      goto LAB_0024d11f;
      pDVar5 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(uVar4 - 0x30) = pDVar5;
      pcVar6 = (args->first).d.ptr;
      (args->first).d.ptr = (char16_t *)0x0;
      *(char16_t **)(uVar4 - 0x28) = pcVar6;
      qVar7 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(uVar4 - 0x20) = qVar7;
      pDVar8 = (args->second).super_QList<ProString>.d.d;
      (args->second).super_QList<ProString>.d.d = (Data *)0x0;
      *(Data **)(uVar4 - 0x18) = pDVar8;
      pPVar9 = (args->second).super_QList<ProString>.d.ptr;
      (args->second).super_QList<ProString>.d.ptr = (ProString *)0x0;
      *(ProString **)(uVar4 - 0x10) = pPVar9;
      qVar7 = (args->second).super_QList<ProString>.d.size;
      (args->second).super_QList<ProString>.d.size = 0;
      *(qsizetype *)(uVar4 - 8) = qVar7;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }